

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::insertpoint_abort(tetgenmesh *this,face *splitseg,insertvertexflags *ivf)

{
  uint *puVar1;
  arraypool *paVar2;
  long lVar3;
  char **ppcVar4;
  long lVar5;
  arraypool *paVar6;
  long lVar7;
  
  paVar2 = this->caveoldtetlist;
  lVar3 = paVar2->objects;
  if (0 < lVar3) {
    ppcVar4 = paVar2->toparray;
    lVar7 = 0;
    do {
      lVar5 = *(long *)(ppcVar4[(uint)lVar7 >> ((byte)paVar2->log2objectsperblock & 0x1f)] +
                       (long)paVar2->objectbytes *
                       (long)(int)(paVar2->objectsperblockmark & (uint)lVar7));
      puVar1 = (uint *)(lVar5 + (long)this->elemmarkerindex * 4);
      *puVar1 = *puVar1 & 0xfffffffe;
      puVar1 = (uint *)(lVar5 + (long)this->elemmarkerindex * 4);
      *puVar1 = *puVar1 & 0xfffffffd;
      lVar7 = lVar7 + 1;
    } while (lVar3 != lVar7);
  }
  paVar6 = this->cavebdrylist;
  lVar3 = paVar6->objects;
  if (0 < lVar3) {
    ppcVar4 = paVar6->toparray;
    lVar7 = 0;
    do {
      puVar1 = (uint *)(*(long *)(ppcVar4[(uint)lVar7 >> ((byte)paVar6->log2objectsperblock & 0x1f)]
                                 + (long)paVar6->objectbytes *
                                   (long)(int)(paVar6->objectsperblockmark & (uint)lVar7)) +
                       (long)this->elemmarkerindex * 4);
      *puVar1 = *puVar1 & 0xfffffffd;
      lVar7 = lVar7 + 1;
    } while (lVar3 != lVar7);
  }
  this->cavetetlist->objects = 0;
  paVar6->objects = 0;
  paVar2->objects = 0;
  this->cavetetseglist->objects = 0;
  this->cavetetshlist->objects = 0;
  if (ivf->splitbdflag != 0) {
    if ((splitseg != (face *)0x0) && (splitseg->sh != (shellface *)0x0)) {
      puVar1 = (uint *)((long)splitseg->sh + (long)this->shmarkindex * 4 + 4);
      *puVar1 = *puVar1 & 0xfffffffd;
    }
    paVar2 = this->caveshlist;
    lVar3 = paVar2->objects;
    if (0 < lVar3) {
      ppcVar4 = paVar2->toparray;
      lVar7 = 0;
      do {
        puVar1 = (uint *)(*(long *)(ppcVar4[(uint)lVar7 >>
                                            ((byte)paVar2->log2objectsperblock & 0x1f)] +
                                   (long)paVar2->objectbytes *
                                   (long)(int)(paVar2->objectsperblockmark & (uint)lVar7)) + 4 +
                         (long)this->shmarkindex * 4);
        *puVar1 = *puVar1 & 0xfffffffd;
        lVar7 = lVar7 + 1;
      } while (lVar3 != lVar7);
    }
    paVar2->objects = 0;
    this->cavesegshlist->objects = 0;
  }
  return;
}

Assistant:

void tetgenmesh::insertpoint_abort(face *splitseg, insertvertexflags *ivf)
{
  triface *cavetet;
  face *parysh;
  int i;

  for (i = 0; i < caveoldtetlist->objects; i++) {
    cavetet = (triface *) fastlookup(caveoldtetlist, i);
    uninfect(*cavetet);
    unmarktest(*cavetet);
  }
  for (i = 0; i < cavebdrylist->objects; i++) {
    cavetet = (triface *) fastlookup(cavebdrylist, i);
    unmarktest(*cavetet); 
  }
  cavetetlist->restart();
  cavebdrylist->restart();
  caveoldtetlist->restart();
  cavetetseglist->restart();
  cavetetshlist->restart();
  if (ivf->splitbdflag) { 
    if ((splitseg != NULL) && (splitseg->sh != NULL)) {
      sunmarktest(*splitseg);
    }
    for (i = 0; i < caveshlist->objects; i++) {
      parysh = (face *) fastlookup(caveshlist, i);
      sunmarktest(*parysh);
    }
    caveshlist->restart();
    cavesegshlist->restart();
  }
}